

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::concat<kj::String,kj::FixedArray<char,1ul>>
          (String *__return_storage_ptr__,_ *this,String *params,FixedArray<char,_1UL> *params_1)

{
  void *__src;
  long lVar1;
  size_t size;
  char *__dest;
  void *pvVar2;
  size_t local_30 [2];
  
  size = 0;
  local_30[0] = *(long *)(this + 8) - 1;
  if (*(long *)(this + 8) == 0) {
    local_30[0] = size;
  }
  local_30[1] = 1;
  lVar1 = 0;
  do {
    size = size + *(long *)((long)local_30 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  heapString(__return_storage_ptr__,size);
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  __src = *(void **)this;
  pvVar2 = (void *)((long)__src + *(long *)(this + 8) + -1);
  if (*(long *)(this + 8) == 0) {
    pvVar2 = (void *)0x0;
    __src = (void *)0x0;
  }
  if (__src != pvVar2) {
    memcpy(__dest,__src,(long)pvVar2 - (long)__src);
    __dest = __dest + ((long)pvVar2 - (long)__src);
  }
  *__dest = *(char *)&(params->content).ptr;
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}